

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_DrawConsole(bool hw2d)

{
  uint uVar1;
  AActor *pAVar2;
  FBrokenLines **ppFVar3;
  bool bVar4;
  FFont *this;
  DFrameBuffer *this_00;
  int iVar5;
  int iVar6;
  int iVar7;
  BYTE *pBVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  player_t *ppVar12;
  uint scale;
  int iVar13;
  FTexture *img;
  BYTE character;
  undefined8 uVar14;
  FBrokenLines **ppFVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  int local_13c;
  char tickstr [256];
  
  scale = con_scale.Value;
  if (con_scale.Value < 1) {
    iVar5 = 2;
    if (2 < CleanXfac) {
      iVar5 = CleanXfac;
    }
    scale = iVar5 - 1;
  }
  iVar5 = ConFont->FontHeight;
  iVar13 = (ConBottom / (int)scale + iVar5 * -2) / iVar5;
  if (ConBottom / (int)scale - (iVar5 * 7) / 2 < (iVar13 + -1) * iVar5) {
    iVar5 = iVar5 / 2;
    iVar13 = iVar13 + -1;
  }
  if ((ConBottom < C_DrawConsole::oldbottom) &&
     ((((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)) &&
       (viewwindowy != 0 || viewwindowx != 0)) && (viewactive)))) {
    V_SetBorderNeedRefresh();
  }
  iVar18 = ConBottom;
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState == c_up) {
    FNotifyBuffer::Draw(&NotifyStrings);
    return;
  }
  if (ConBottom != 0) {
    if ((uint)conback.texnum < TexMan.Textures.Count) {
      img = TexMan.Textures.Array[conback.texnum].Texture;
    }
    else {
      img = (FTexture *)0x0;
    }
    uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    uVar14 = 0xaf000000;
    if (conshade == '\0') {
      uVar14 = 0;
    }
    if (gamestate == GS_FULLCONSOLE) {
      dVar19 = 1.0;
    }
    else {
      dVar19 = (double)con_alpha.Value;
    }
    if (!hw2d) {
      dVar19 = 1.0;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,img,0.0,(double)(int)(ConBottom - uVar1),0x40001389,dVar19,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,0x4000138a,
               (ulong)uVar1,0x400013aa,uVar14,0x4000138c,0x400013a5,0,0);
    if ((conline == '\x01') && (iVar18 < (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (screen,0,(ulong)(uint)iVar18,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,(ulong)(iVar18 + 1),
                 0,0);
    }
    this_00 = screen;
    this = ConFont;
    if (0xb < ConBottom) {
      iVar18 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      if (scale == 1) {
        pBVar8 = (BYTE *)GetVersionString();
        iVar6 = FFont::StringWidth(this,pBVar8);
        iVar16 = ConBottom - ConFont->FontHeight;
        pcVar9 = GetVersionString();
        DCanvas::DrawText((DCanvas *)this_00,this,8,(iVar18 - iVar6) + -8,iVar16 + -4,pcVar9,0);
      }
      else {
        pBVar8 = (BYTE *)GetVersionString();
        iVar16 = FFont::StringWidth(this,pBVar8);
        iVar17 = ConBottom / (int)scale;
        iVar6 = ConFont->FontHeight;
        pcVar9 = GetVersionString();
        DCanvas::DrawText((DCanvas *)this_00,this,8,(iVar18 / (int)scale - iVar16) + -8,
                          (iVar17 - iVar6) + -4,pcVar9,0x40001399,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)(int)scale
                          & 0xffffffff,0x4000139a,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                          (long)(int)scale & 0xffffffff,0x400013a8,1,0);
      }
      pcVar9 = TickerLabel;
      if (TickerMax == 0) {
        TickerVisible = 0;
      }
      else {
        iVar17 = ConBottom / (int)scale;
        iVar18 = ConFont->FontHeight;
        iVar6 = 0;
        iVar16 = (screen->super_DSimpleCanvas).super_DCanvas.Width / (int)scale;
        iVar16 = (int)((ulong)((long)iVar16 * 0x49f49f49) >> 0x20) - iVar16;
        iVar16 = ConCols / scale + ((iVar16 >> 6) - (iVar16 >> 0x1f)) + -6;
        if (TickerLabel != (char *)0x0) {
          sVar10 = strlen(TickerLabel);
          iVar6 = (int)sVar10 + 2;
          mysnprintf(tickstr,0x100,"%s: ",pcVar9);
        }
        iVar7 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
        if (0x100 - iVar7 < iVar16) {
          iVar16 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          iVar16 = 0x100 - iVar16;
        }
        tickstr[iVar6] = '\x10';
        memset(tickstr + (long)iVar6 + 1,0x11,(long)(iVar16 - iVar6));
        lVar11 = (long)iVar16;
        (tickstr + lVar11 + 1)[0] = '\x12';
        (tickstr + lVar11 + 1)[1] = ' ';
        if (TickerPercent == true) {
          mysnprintf(tickstr + lVar11 + 3,0xfd - lVar11,"%d%%",
                     ((long)(int)TickerAt * 100) / (long)(int)TickerMax & 0xffffffff);
        }
        else {
          tickstr[lVar11 + 3] = '\0';
        }
        iVar18 = (iVar17 - iVar18) + -4;
        if (scale == 1) {
          DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar18,tickstr,0);
        }
        else {
          DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar18,tickstr,0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                            (long)(int)scale & 0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                            (long)(int)scale & 0xffffffff,0x400013a8,1,0);
        }
        iVar6 = (int)(((long)((iVar16 - iVar6) * 8) * (long)(int)TickerAt) / (long)(int)TickerMax) +
                iVar6 * 8 + 0xd;
        if (scale == 1) {
          DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar6,iVar18,'\x13',0);
        }
        else {
          DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar6,iVar18,'\x13',0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                            (long)(int)scale & 0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                            (long)(int)scale & 0xffffffff,0x400013a8,1,0);
        }
        TickerVisible = 1;
      }
    }
    if (StatusBar != (DBaseStatusBar *)0x0 && !hw2d) {
      ppVar12 = StatusBar->CPlayer;
      pAVar2 = (ppVar12->camera).field_0.p;
      if (pAVar2 != (AActor *)0x0) {
        if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (((ppVar12->camera).field_0.p)->player != (player_t *)0x0) {
            ppVar12 = ((ppVar12->camera).field_0.p)->player;
          }
        }
        else {
          (ppVar12->camera).field_0.p = (AActor *)0x0;
        }
      }
      if (((ppVar12->BlendA != 0.0) || (NAN(ppVar12->BlendA))) &&
         ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (screen,(ulong)((int)(ppVar12->BlendB * 255.0) & 0xffU |
                                 ((int)(ppVar12->BlendG * 255.0) & 0xffU) << 8 |
                                 ((int)(ppVar12->BlendR * 255.0) & 0xffU) << 0x10),0,
                   (ulong)(uint)ConBottom,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height - ConBottom));
        ST_SetNeedRefresh();
        V_SetBorderNeedRefresh();
      }
    }
  }
  if ((menuactive == MENU_Off) && (0 < iVar13)) {
    FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / (int)scale);
    ppFVar3 = (conbuffer->mBrokenLines).Array;
    iVar6 = ConBottom / (int)scale;
    iVar18 = ConFont->FontHeight;
    ConsoleDrawing = 1;
    if (ppFVar3 <= ppFVar3 + (ulong)(uint)conbuffer->mTextLines + (-1 - (long)RowAdjust)) {
      ppFVar15 = ppFVar3 + (((ulong)(uint)conbuffer->mTextLines - 2) - (long)RowAdjust);
      do {
        iVar16 = ConFont->FontHeight * iVar13 - iVar5;
        pcVar9 = (ppFVar15[1]->Text).Chars;
        if (scale == 1) {
          DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar16,pcVar9,0);
        }
        else {
          DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar16,pcVar9,0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                            (long)(int)scale & 0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                            (long)(int)scale & 0xffffffff,0x400013a8,1,0);
        }
        if (ppFVar15 < ppFVar3) break;
        ppFVar15 = ppFVar15 + -1;
        bVar4 = 1 < iVar13;
        iVar13 = iVar13 + -1;
      } while (bVar4);
    }
    ConsoleDrawing = 0;
    if (0x13 < ConBottom) {
      iVar5 = iVar6 + iVar18 * -2 + -4;
      if (gamestate != GS_STARTUP) {
        FCommandBuffer::FCommandBuffer((FCommandBuffer *)tickstr,&CmdLine);
        FCommandBuffer::Draw((FCommandBuffer *)tickstr,8,iVar5,scale,cursoron);
        FString::~FString((FString *)tickstr);
      }
      if ((RowAdjust != 0) && ((ConFont->FontHeight * 7) / 2 <= ConBottom)) {
        character = (RowAdjust == conbuffer->mTextLines) * '\x02' + '\n';
        if (scale == 1) {
          DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar5,character,0);
        }
        else {
          DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar5,character,0x40001399,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Width /
                            (long)(int)scale & 0xffffffff,0x4000139a,
                            (long)(screen->super_DSimpleCanvas).super_DCanvas.Height /
                            (long)(int)scale & 0xffffffff,0x400013a8,1,0);
        }
      }
    }
  }
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		NotifyStrings.Draw();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				FCommandBuffer command(CmdLine);
				command.Draw(left, bottomline, textScale, cursoron);
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}